

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RegexMatcher::split
          (RegexMatcher *this,UnicodeString *input,UnicodeString *dest,int32_t destCapacity,
          UErrorCode *status)

{
  UBool UVar1;
  UText **dest_00;
  UText *pUVar2;
  int local_d4;
  int32_t fieldCount;
  int32_t i;
  UText **destText;
  UText inputText;
  UErrorCode *status_local;
  int32_t destCapacity_local;
  UnicodeString *dest_local;
  UnicodeString *input_local;
  RegexMatcher *this_local;
  
  inputText._136_8_ = status;
  memset(&destText,0,0x90);
  destText._0_4_ = 0x345ad82c;
  inputText.flags = 0x90;
  utext_openConstUnicodeString_63((UText *)&destText,input,(UErrorCode *)inputText._136_8_);
  UVar1 = ::U_FAILURE(*(UErrorCode *)inputText._136_8_);
  if (UVar1 == '\0') {
    dest_00 = (UText **)uprv_malloc_63((long)destCapacity << 3);
    if (dest_00 == (UText **)0x0) {
      *(undefined4 *)inputText._136_8_ = 7;
      this_local._4_4_ = 0;
    }
    else {
      for (local_d4 = 0; local_d4 < destCapacity; local_d4 = local_d4 + 1) {
        pUVar2 = utext_openUnicodeString_63
                           ((UText *)0x0,dest + local_d4,(UErrorCode *)inputText._136_8_);
        dest_00[local_d4] = pUVar2;
      }
      this_local._4_4_ =
           split(this,(UText *)&destText,dest_00,destCapacity,(UErrorCode *)inputText._136_8_);
      for (local_d4 = 0; local_d4 < destCapacity; local_d4 = local_d4 + 1) {
        utext_close_63(dest_00[local_d4]);
      }
      uprv_free_63(dest_00);
      utext_close_63((UText *)&destText);
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t  RegexMatcher::split(const UnicodeString &input,
        UnicodeString    dest[],
        int32_t          destCapacity,
        UErrorCode      &status)
{
    UText inputText = UTEXT_INITIALIZER;
    utext_openConstUnicodeString(&inputText, &input, &status);
    if (U_FAILURE(status)) {
        return 0;
    }

    UText **destText = (UText **)uprv_malloc(sizeof(UText*)*destCapacity);
    if (destText == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }
    int32_t i;
    for (i = 0; i < destCapacity; i++) {
        destText[i] = utext_openUnicodeString(NULL, &dest[i], &status);
    }

    int32_t fieldCount = split(&inputText, destText, destCapacity, status);

    for (i = 0; i < destCapacity; i++) {
        utext_close(destText[i]);
    }

    uprv_free(destText);
    utext_close(&inputText);
    return fieldCount;
}